

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool __thiscall
gguf_reader::read<long>(gguf_reader *this,vector<long,_std::allocator<long>_> *dst,size_t n)

{
  bool bVar1;
  long *plVar2;
  vector<long,_std::allocator<long>_> *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  size_t i;
  long *dst_00;
  long *local_28;
  
  std::vector<long,_std::allocator<long>_>::resize(in_RDI,(size_type)in_RSI);
  local_28 = (long *)0x0;
  while( true ) {
    dst_00 = local_28;
    plVar2 = (long *)std::vector<long,_std::allocator<long>_>::size(in_RSI);
    if (plVar2 <= dst_00) {
      return true;
    }
    std::vector<long,_std::allocator<long>_>::operator[](in_RSI,(size_type)local_28);
    bVar1 = read<long>((gguf_reader *)in_RDI,dst_00);
    if (!bVar1) break;
    local_28 = (long *)((long)local_28 + 1);
  }
  return false;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }